

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O0

int __thiscall DIS::RecordSpecification::getMarshalledSize(RecordSpecification *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_38 [8];
  RecordSpecificationElement listElement;
  unsigned_long_long idx;
  int marshalSize;
  RecordSpecification *this_local;
  
  idx._4_4_ = 4;
  listElement._recordLength = 0;
  listElement._recordCount = 0;
  listElement._recordValues = 0;
  listElement._pad4 = '\0';
  listElement._23_1_ = 0;
  while( true ) {
    uVar1 = listElement._16_8_;
    sVar3 = std::
            vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
            ::size(&this->_recordSets);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::
             vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
             ::operator[](&this->_recordSets,listElement._16_8_);
    RecordSpecificationElement::RecordSpecificationElement
              ((RecordSpecificationElement *)local_38,pvVar4);
    iVar2 = RecordSpecificationElement::getMarshalledSize((RecordSpecificationElement *)local_38);
    idx._4_4_ = idx._4_4_ + iVar2;
    RecordSpecificationElement::~RecordSpecificationElement((RecordSpecificationElement *)local_38);
    listElement._16_8_ = listElement._16_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int RecordSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfRecordSets

   for(unsigned long long idx=0; idx < _recordSets.size(); idx++)
   {
        RecordSpecificationElement listElement = _recordSets[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}